

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZVTKGeoMesh.cpp
# Opt level: O3

void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh *gmesh,ofstream *file,TPZVec<double> *elData)

{
  TPZGeoEl *gel;
  char cVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  TPZGeoEl **ppTVar6;
  TPZGeoNode *pTVar7;
  ostream *poVar8;
  ulong uVar9;
  int64_t iVar10;
  int c;
  long lVar11;
  stringstream connectivity;
  stringstream node;
  stringstream index;
  stringstream eldim;
  stringstream eldat;
  stringstream material;
  stringstream type;
  long *local_b58;
  long local_b50;
  long local_b48 [2];
  int64_t local_b38;
  long local_b30;
  int local_b24;
  long local_b20;
  long local_b18;
  ulong local_b10;
  TPZVec<double> *local_b08;
  int64_t local_b00;
  ofstream *local_af8;
  TPZChunkVector<TPZGeoEl_*,_10> *local_af0;
  stringstream local_ae8 [16];
  long local_ad8 [14];
  ios_base aiStack_a68 [264];
  stringstream local_960 [16];
  long local_950 [14];
  ios_base aiStack_8e0 [264];
  stringstream local_7d8 [16];
  undefined1 local_7c8 [112];
  ios_base aiStack_758 [264];
  stringstream local_650 [16];
  undefined1 local_640 [112];
  ios_base aiStack_5d0 [264];
  stringstream local_4c8 [128];
  ios_base aiStack_448 [264];
  stringstream local_340 [16];
  undefined1 local_330 [112];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base aiStack_138 [264];
  
  local_b08 = elData;
  if ((gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements != elData->fNElements) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Wrong vector size of elements data!",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"See ",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "static void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh *, std::ofstream &, TPZVec<REAL> &)"
               ,0x57);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  std::ios::clear((int)*(undefined8 *)(*(long *)file + -0x18) + (int)file);
  local_b00 = (gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  std::__cxx11::stringstream::stringstream(local_960);
  std::__cxx11::stringstream::stringstream(local_ae8);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  std::__cxx11::stringstream::stringstream(local_4c8);
  std::__cxx11::stringstream::stringstream(local_650);
  std::__cxx11::stringstream::stringstream(local_7d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)file,"# vtk DataFile Version 3.0",0x1a);
  cVar1 = (char)file;
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)file,"TPZGeoMesh VTK Visualization",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"ASCII",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar1);
  std::ostream::put(cVar1);
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)file,"DATASET UNSTRUCTURED_GRID",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"POINTS ",7);
  cVar1 = (char)local_950;
  if (0 < local_b00) {
    local_af0 = &(gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
    local_b30 = -1;
    local_b20 = 0;
    iVar10 = 0;
    local_b18 = 0;
    local_af8 = file;
    do {
      local_b38 = iVar10;
      ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_af0,iVar10);
      gel = *ppTVar6;
      if (((gel != (TPZGeoEl *)0x0) &&
          ((iVar3 = (**(code **)(*(long *)gel + 0xb8))(gel), iVar3 != 1 ||
           (cVar2 = (**(code **)(*(long *)gel + 0xd0))(gel), cVar2 != '\0')))) &&
         ((local_b08->fStore[local_b38] != -999.0 || (NAN(local_b08->fStore[local_b38]))))) {
        uVar4 = (**(code **)(*(long *)gel + 0xb8))(gel);
        uVar9 = (ulong)uVar4;
        switch(uVar9) {
        case 0:
          uVar9 = 1;
          break;
        case 1:
          uVar9 = 2;
          break;
        case 2:
          uVar9 = 3;
          break;
        case 3:
          uVar9 = 4;
          break;
        case 4:
        case 5:
        case 6:
          break;
        case 7:
          uVar9 = 8;
          break;
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"ElementType not found!",0x16);
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Common/pzeltype.h"
                     ,0x77);
        }
        local_b10 = uVar9;
        std::ostream::operator<<(local_ad8,(int)uVar9);
        local_b24 = 1;
        if (1 < (int)local_b10) {
          local_b24 = (int)local_b10;
        }
        iVar3 = 0;
        do {
          lVar11 = 0;
          do {
            iVar10 = (**(code **)(*(long *)gel + 0xa8))(gel,iVar3);
            pTVar7 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                               (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,iVar10);
            poVar8 = std::ostream::_M_insert<double>(pTVar7->fCoord[lVar11]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          std::ios::widen((char)*(undefined8 *)(local_950[0] + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_ad8," ",1);
          local_b30 = local_b30 + 1;
          std::ostream::_M_insert<long>((long)local_ad8);
          iVar3 = iVar3 + 1;
        } while (iVar3 != local_b24);
        std::ios::widen((char)*(undefined8 *)(local_ad8[0] + -0x18) + (char)local_ad8);
        file = local_af8;
        std::ostream::put((char)local_ad8);
        std::ostream::flush();
        iVar3 = GetVTK_ElType(gel);
        plVar5 = (long *)std::ostream::operator<<(local_1a8,iVar3);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
        poVar8 = std::ostream::_M_insert<double>(local_b08->fStore[local_b38]);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        plVar5 = (long *)std::ostream::operator<<(local_330,gel->fMatId);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
        iVar3 = (**(code **)(*(long *)gel + 0x210))(gel);
        plVar5 = (long *)std::ostream::operator<<(local_640,iVar3);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
        poVar8 = std::ostream::_M_insert<long>((long)local_7c8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        local_b20 = local_b20 + (ulong)((int)local_b10 + 1);
        local_b18 = local_b18 + 1;
      }
      iVar10 = local_b38 + 1;
    } while (iVar10 != local_b00);
  }
  std::ios::widen((char)*(undefined8 *)(local_950[0] + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," float",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  poVar8 = (ostream *)std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_b58,local_b50);
  if (local_b58 != local_b48) {
    operator_delete(local_b58,local_b48[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"CELLS ",6);
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)file,(char *)local_b58,local_b50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_b58 != local_b48) {
    operator_delete(local_b58,local_b48[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"CELL_TYPES ",0xb);
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)file,(char *)local_b58,local_b50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if (local_b58 != local_b48) {
    operator_delete(local_b58,local_b48[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"CELL_DATA",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file," ",1);
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"FIELD FieldData 4",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + (char)file);
  std::ostream::put((char)file);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"ElData 1 ",9);
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," float",6);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)local_b58,local_b50);
  if (local_b58 != local_b48) {
    operator_delete(local_b58,local_b48[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"Material 1 ",0xb);
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," int",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)local_b58,local_b50);
  if (local_b58 != local_b48) {
    operator_delete(local_b58,local_b48[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"Dimension 1 ",0xc);
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," int",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)local_b58,local_b50);
  if (local_b58 != local_b48) {
    operator_delete(local_b58,local_b48[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"elIndex 1 ",10);
  poVar8 = std::ostream::_M_insert<long>((long)file);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," int",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)local_b58,local_b50);
  if (local_b58 != local_b48) {
    operator_delete(local_b58,local_b48[0] + 1);
  }
  std::ofstream::close();
  std::__cxx11::stringstream::~stringstream(local_7d8);
  std::ios_base::~ios_base(aiStack_758);
  std::__cxx11::stringstream::~stringstream(local_650);
  std::ios_base::~ios_base(aiStack_5d0);
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  std::__cxx11::stringstream::~stringstream(local_ae8);
  std::ios_base::~ios_base(aiStack_a68);
  std::__cxx11::stringstream::~stringstream(local_960);
  std::ios_base::~ios_base(aiStack_8e0);
  return;
}

Assistant:

void TPZVTKGeoMesh::PrintGMeshVTK(TPZGeoMesh * gmesh, std::ofstream &file, TPZVec<REAL> &elData) {
    if (gmesh->NElements() != elData.NElements()) {
        std::cout << "Wrong vector size of elements data!" << std::endl;
        std::cout << "See " << __PRETTY_FUNCTION__ << std::endl;
    }
    file.clear();
    int64_t nelements = gmesh->NElements();

    std::stringstream node, connectivity, type, material, eldat, eldim, index;

    //Header
    file << "# vtk DataFile Version 3.0" << std::endl;
    file << "TPZGeoMesh VTK Visualization" << std::endl;
    file << "ASCII" << std::endl << std::endl;

    file << "DATASET UNSTRUCTURED_GRID" << std::endl;
    file << "POINTS ";

    int64_t actualNode = -1, size = 0, nVALIDelements = 0;
    TPZGeoEl *gel;

    for (int64_t el = 0; el < nelements; el++) {
        gel = gmesh->ElementVec()[el];
        if (!gel || (gel->Type() == EOned && !gel->IsLinearMapping()))//Exclude Arc3D and Ellipse3D
        {
            continue;
        }
        if (elData[el] == -999.) {
            continue;
        }

        MElementType elt = gel->Type();
        int elNnodes = MElementType_NNodes(elt);

        size += (1 + elNnodes);
        connectivity << elNnodes;

        for (int t = 0; t < elNnodes; t++) {
            for (int c = 0; c < 3; c++) {
                double coord = gmesh->NodeVec()[gel->NodeIndex(t)].Coord(c);
                node << coord << " ";
            }
            node << std::endl;

            actualNode++;
            connectivity << " " << actualNode;
        }
        connectivity << std::endl;

        int elType = TPZVTKGeoMesh::GetVTK_ElType(gel);
        type << elType << std::endl;

        eldat  << elData[el] << std::endl;
        material << gel->MaterialId() << std::endl;
        eldim << gel->Dimension() << std::endl;


        index << gel->Index() << std::endl;

        nVALIDelements++;
    }
    node << std::endl;
    actualNode++;
    file << actualNode << " float" << std::endl << node.str();

    file << "CELLS " << nVALIDelements << " ";

    file << size << std::endl;
    file << connectivity.str() << std::endl;

    file << "CELL_TYPES " << nVALIDelements << std::endl;
    file << type.str() << std::endl;

    file << "CELL_DATA" << " " << nVALIDelements << std::endl;
    file << "FIELD FieldData 4" << std::endl;

    file << "ElData 1 " << nVALIDelements << " float" << std::endl;
    file << eldat.str();

    file << "Material 1 " << nVALIDelements << " int" << std::endl;
    file << material.str();

    file << "Dimension 1 " << nVALIDelements << " int" << std::endl;
    file << eldim.str();

    file << "elIndex 1 " << nVALIDelements << " int" << std::endl;
    file << index.str();

    file.close();
}